

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnnLayerTanh.cpp
# Opt level: O3

bool __thiscall tfs::DnnLayerTanh::runForward(DnnLayerTanh *this)

{
  Matrix *pMVar1;
  Matrix *pMVar2;
  double *pdVar3;
  bool bVar4;
  double *pdVar5;
  double *pdVar6;
  double dVar7;
  
  pMVar1 = (this->super_DnnLayer).m_in_a;
  if ((pMVar1 != (Matrix *)0x0) &&
     (pMVar2 = (this->super_DnnLayer).m_out_a, pMVar2 != (Matrix *)0x0)) {
    pdVar5 = pMVar1->m_data;
    pdVar3 = pMVar1->m_end;
    if (pdVar5 < pdVar3) {
      pdVar6 = pMVar2->m_data;
      do {
        dVar7 = *pdVar5;
        pdVar5 = pdVar5 + 1;
        dVar7 = tanh(dVar7);
        *pdVar6 = dVar7;
        pdVar6 = pdVar6 + 1;
      } while (pdVar5 < pdVar3);
    }
    return true;
  }
  bVar4 = report_problem("Error",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/src/DnnLayerTanh.cpp"
                         ,"runForward",0x25,"Not configured correctly");
  return bVar4;
}

Assistant:

bool
    DnnLayerTanh::runForward( void ) {
        // -----------------------------------------------------------------------------------
        // Forward propagate while training
        // S = size of input data
        // m_in_a[S]
        // m_out_a[S]
        // ok: 24 May 2016
        // -----------------------------------------------------------------------------------
        if( m_in_a == 0 || m_out_a == 0 ) {
            return log_error( "Not configured correctly" );
        }
        const DNN_NUMERIC *        input = m_in_a->dataReadOnly();
        const DNN_NUMERIC * const  inEnd = m_in_a->end();     // A pointer just past the end of the input
        DNN_NUMERIC       *       output = m_out_a->data();   // activations[S] for the neurons in this layer
        
        while( input < inEnd ) {
            *output++ = tanh( *input++ );
        }
        return true;
    }